

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O2

void __thiscall tonk::UDPSocket::postNextRead(UDPSocket *this,uint8_t *readBuffer)

{
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar1;
  long lVar2;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
  *this_00;
  ptr local_68;
  anon_class_16_2_48e8bdf1 local_50;
  mutable_buffers_1 local_40;
  
  (this->SourceAddress).impl_.data_.base.sa_family = 2;
  local_68.h = &local_50;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 2) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 10) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0xc) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0x14) = 0;
  pbVar1 = (this->Socket)._M_t.
           super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
           ._M_head_impl;
  local_40.super_mutable_buffer.size_ = 0x546;
  lVar2 = *(long *)&(pbVar1->
                    super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                    ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>;
  local_50.this = this;
  local_50.readBuffer = readBuffer;
  local_40.super_mutable_buffer.data_ = readBuffer;
  this_00 = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
             *)asio::asio_handler_allocate(0x70,local_68.h);
  local_68.v = this_00;
  asio::detail::
  reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ::reactive_socket_recvfrom_op_base
            ((reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
              *)this_00,
             (((implementation_type *)
              ((long)&(pbVar1->
                      super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                      ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> +
              8))->super_base_implementation_type).socket_,2,&local_40,&this->SourceAddress,0,
             asio::detail::
             reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:400:9)>
             ::do_complete);
  (this_00->handler_).this = local_50.this;
  (this_00->handler_).readBuffer = local_50.readBuffer;
  local_68.p = this_00;
  asio::detail::reactive_socket_service_base::start_op
            ((reactive_socket_service_base *)(lVar2 + 0x28),
             (base_implementation_type *)
             ((long)&(pbVar1->
                     super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                     ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> + 8
             ),0,(reactor_op *)this_00,false,true,false);
  local_68.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
                *)0x0;
  local_68.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:400:9)>
                *)0x0;
  asio::detail::
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:400:9)>
  ::ptr::reset(&local_68);
  return;
}

Assistant:

void UDPSocket::postNextRead(uint8_t* readBuffer)
{
    // Clear source address to allow us to check if it's filled later
    // during error handling
    SourceAddress = UDPAddress();

    TONK_IF_DEBUG(++OutstandingRecvs);

    // Dispatch asynchronous recvfrom()
    Socket->async_receive_from(
        asio::buffer(readBuffer, kReadBufferBytes),
        SourceAddress,
        [this, readBuffer](const asio::error_code& error, size_t bytes_transferred)
    {
        // Grab the receive timestamp right away
        const uint64_t receiveUsec = siamese::GetTimeUsec();

        TONK_IF_DEBUG(--OutstandingRecvs);

        uint8_t* nextReadBuffer = readBuffer;

        // If there was an error reported:
        if (error)
        {
            // If no source address was provided:
            if (SourceAddress.address().is_unspecified())
            {
                if (!SocketClosed) {
                    Deps.Logger->Warning("Socket receive failed unexpectedly");
                }

                Deps.SocketRefCount->StartShutdown(
                    Tonk_NetworkFailed,
                    Result("async_receive_from failed",
                        error.message(),
                        ErrorType::Asio,
                        error.value()));

                // Note this stops posting read requests
                Deps.SocketRefCount->DecrementReferences();

                return;
            }

            // Otherwise we assume it is due to ICMP message from a peer:

            // Handle peer-specific failure that is not catastrophic
            IConnection* icon = AddressMap.FindByAddr(SourceAddress);
            if (icon) {
                Connection* connection = reinterpret_cast<Connection*>(icon);
                connection->OnICMPError(error);
            }

            // Fall-thru to continue reading datagrams
        }
        else if (bytes_transferred <= 0)
        {
            if (!SocketClosed) {
                Deps.Logger->Warning("Socket closed unexpectedly");
            }

            // Start shutdown
            Deps.SocketRefCount->StartShutdown(Tonk_NetworkFailed, Result("UDP socket closed", "Socket closed", ErrorType::Tonk, Tonk_NetworkFailed));

            // Note no read request is posted here
            Deps.SocketRefCount->DecrementReferences();

            return;
        }
        else
        {
#ifdef TONK_FOIL_BUFFER_STEALING
            // Clear remaining receive buffer to foil buffer-stealing attacks
            memset(buffer + bytes_transferred, 0xfe, bufferBytes - bytes_transferred);
#endif

#ifdef TONK_ENABLE_ARTIFICIAL_PACKETLOSS
            if (m_ArtificialPacketlossThreshold > 0)
            {
                const uint32_t word = ArtificialPacketlossPRNG.Next() & 0x7fffffff;
                if (word < m_ArtificialPacketlossThreshold)
                {
                    //ModuleLogger.Trace("ARTIFICAL DROPPED DATAGRAM HERE");

                    // Reuse the same read buffer to post another read request
                    postNextRead(nextReadBuffer);

                    return; // Do not handle this datagram
                }
            }
#endif // TONK_ENABLE_ARTIFICIAL_PACKETLOSS

            TONK_DEBUG_ASSERT(bytes_transferred <= kReadBufferBytes);
            const unsigned receivedBytes = static_cast<unsigned>(bytes_transferred);

            const BufferResult result = onUDPDatagram(
                receiveUsec,
                SourceAddress,
                readBuffer,
                receivedBytes);

            if (result == BufferResult::InUse) {
                // Allocate a new buffer for the next read
                nextReadBuffer = Deps.ReadBufferAllocator->Allocate(kReadBufferBytes);
            }
        }

        // Post next read buffer
        postNextRead(nextReadBuffer);
    });
}